

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

string_view __thiscall inja::convert_dot_to_json_pointer(inja *this,string_view dot,string *out)

{
  string_view view;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  char *s;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string *local_70;
  const_pointer local_68;
  pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  undefined1 local_40 [8];
  string_view part;
  string *out_local;
  string_view dot_local;
  
  part.size_ = dot.size_;
  dot_local.data_ = dot.data_;
  out_local = (string *)this;
  std::__cxx11::string::clear();
  do {
    nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    local_70 = out_local;
    local_68 = dot_local.data_;
    view.size_ = (size_type)dot_local.data_;
    view.data_ = (const_pointer)out_local;
    string_view::split(&local_60,view,'.');
    std::
    tie<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
              (&local_80,(basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::
    tuple<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&>
    ::operator=((tuple<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&>
                 *)&local_80,&local_60);
    std::__cxx11::string::push_back((char)part.size_);
    sVar2 = part.size_;
    __first = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::begin
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    __last = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::__cxx11::string::append<char_const*,void>((string *)sVar2,__first,__last);
    bVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  s = (char *)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&dot_local.size_,s,sVar2);
  return stack0xffffffffffffffe8;
}

Assistant:

inline nonstd::string_view convert_dot_to_json_pointer(nonstd::string_view dot, std::string& out) {
	out.clear();
	do {
		nonstd::string_view part;
		std::tie(part, dot) = string_view::split(dot, '.');
		out.push_back('/');
		out.append(part.begin(), part.end());
	} while (!dot.empty());
	return nonstd::string_view(out.data(), out.size());
}